

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.cpp
# Opt level: O0

int zmq::tcp_write(fd_t s_,void *data_,size_t size_)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  bool bVar4;
  char *errstr;
  ssize_t nbytes;
  int local_4;
  
  sVar1 = send(in_EDI,in_RSI,in_RDX,0);
  if ((sVar1 == -1) &&
     (((piVar2 = __errno_location(), *piVar2 == 0xb || (piVar2 = __errno_location(), *piVar2 == 0xb)
       ) || (piVar2 = __errno_location(), *piVar2 == 4)))) {
    local_4 = 0;
  }
  else if (sVar1 == -1) {
    piVar2 = __errno_location();
    bVar4 = false;
    if (*piVar2 != 0xd) {
      piVar2 = __errno_location();
      bVar4 = false;
      if (*piVar2 != 9) {
        piVar2 = __errno_location();
        bVar4 = false;
        if (*piVar2 != 0x59) {
          piVar2 = __errno_location();
          bVar4 = false;
          if (*piVar2 != 0xe) {
            piVar2 = __errno_location();
            bVar4 = false;
            if (*piVar2 != 0x6a) {
              piVar2 = __errno_location();
              bVar4 = false;
              if (*piVar2 != 0x5a) {
                piVar2 = __errno_location();
                bVar4 = false;
                if (*piVar2 != 0xc) {
                  piVar2 = __errno_location();
                  bVar4 = false;
                  if (*piVar2 != 0x58) {
                    piVar2 = __errno_location();
                    bVar4 = *piVar2 != 0x5f;
                  }
                }
              }
            }
          }
        }
      }
    }
    if (!bVar4) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp.cpp"
              ,0x101);
      fflush(_stderr);
      zmq_abort((char *)0x30b09c);
    }
    local_4 = -1;
  }
  else {
    local_4 = (int)sVar1;
  }
  return local_4;
}

Assistant:

int zmq::tcp_write (fd_t s_, const void *data_, size_t size_)
{
#ifdef ZMQ_HAVE_WINDOWS

    const int nbytes = send (s_, (char *) data_, static_cast<int> (size_), 0);

    //  If not a single byte can be written to the socket in non-blocking mode
    //  we'll get an error (this may happen during the speculative write).
    const int last_error = WSAGetLastError ();
    if (nbytes == SOCKET_ERROR && last_error == WSAEWOULDBLOCK)
        return 0;

    //  Signalise peer failure.
    if (nbytes == SOCKET_ERROR
        && (last_error == WSAENETDOWN || last_error == WSAENETRESET
            || last_error == WSAEHOSTUNREACH || last_error == WSAECONNABORTED
            || last_error == WSAETIMEDOUT || last_error == WSAECONNRESET))
        return -1;

    //  Circumvent a Windows bug:
    //  See https://support.microsoft.com/en-us/kb/201213
    //  See https://zeromq.jira.com/browse/LIBZMQ-195
    if (nbytes == SOCKET_ERROR && last_error == WSAENOBUFS)
        return 0;

    wsa_assert (nbytes != SOCKET_ERROR);
    return nbytes;

#else
    ssize_t nbytes = send (s_, static_cast<const char *> (data_), size_, 0);

    //  Several errors are OK. When speculative write is being done we may not
    //  be able to write a single byte from the socket. Also, SIGSTOP issued
    //  by a debugging tool can result in EINTR error.
    if (nbytes == -1
        && (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR))
        return 0;

    //  Signalise peer failure.
    if (nbytes == -1) {
#if !defined(TARGET_OS_IPHONE) || !TARGET_OS_IPHONE
        errno_assert (errno != EACCES && errno != EBADF && errno != EDESTADDRREQ
                      && errno != EFAULT && errno != EISCONN
                      && errno != EMSGSIZE && errno != ENOMEM
                      && errno != ENOTSOCK && errno != EOPNOTSUPP);
#else
        errno_assert (errno != EACCES && errno != EDESTADDRREQ
                      && errno != EFAULT && errno != EISCONN
                      && errno != EMSGSIZE && errno != ENOMEM
                      && errno != ENOTSOCK && errno != EOPNOTSUPP);
#endif
        return -1;
    }

    return static_cast<int> (nbytes);

#endif
}